

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O2

unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
__thiscall
duckdb::BindContext::PositionToColumn(BindContext *this,PositionalReferenceExpression *ref)

{
  BinderException *this_00;
  PositionalReferenceExpression *in_RDX;
  string error;
  string column_name;
  string table_name;
  
  table_name._M_dataplus._M_p = (pointer)&table_name.field_2;
  table_name._M_string_length = 0;
  table_name.field_2._M_local_buf[0] = '\0';
  column_name._M_dataplus._M_p = (pointer)&column_name.field_2;
  column_name._M_string_length = 0;
  column_name.field_2._M_local_buf[0] = '\0';
  BindColumn(&error,(BindContext *)ref,in_RDX,&table_name,&column_name);
  if (error._M_string_length == 0) {
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&,std::__cxx11::string&>
              ((duckdb *)this,&column_name,&table_name);
    ::std::__cxx11::string::~string((string *)&error);
    ::std::__cxx11::string::~string((string *)&column_name);
    ::std::__cxx11::string::~string((string *)&table_name);
    return (unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
            )(unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
              )this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this_00,&error);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnRefExpression> BindContext::PositionToColumn(PositionalReferenceExpression &ref) {
	string table_name, column_name;

	string error = BindColumn(ref, table_name, column_name);
	if (!error.empty()) {
		throw BinderException(error);
	}
	return make_uniq<ColumnRefExpression>(column_name, table_name);
}